

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cram_io.c
# Opt level: O0

refs_t * refs_load_fai(refs_t *r_orig,char *fn,int is_err)

{
  int iVar1;
  char *pcVar2;
  BGZF *pBVar3;
  FILE *__stream;
  ushort **ppuVar4;
  longlong lVar5;
  long lVar6;
  void *pvVar7;
  bool bVar8;
  int local_3110;
  int local_3104;
  int x;
  ref_entry *re;
  khint_t k;
  int n;
  char *cp;
  ref_entry *e;
  int id_alloc;
  int id;
  size_t fn_l;
  refs_t *r;
  char line [8192];
  char fai_fn [4096];
  FILE *fp;
  stat sb;
  int is_err_local;
  char *fn_local;
  refs_t *r_orig_local;
  
  fn_l = (size_t)r_orig;
  sb.__glibc_reserved[2]._4_4_ = is_err;
  _id_alloc = strlen(fn);
  e._4_4_ = 0;
  e._0_4_ = 0;
  if ((fn_l != 0) || (fn_l = (size_t)refs_create(), (refs_t *)fn_l != (refs_t *)0x0)) {
    iVar1 = stat(fn,(stat *)&fp);
    if (iVar1 == 0) {
      if ((*(long *)(fn_l + 0x28) == 0) || (iVar1 = bgzf_close(*(BGZF **)(fn_l + 0x28)), iVar1 == 0)
         ) {
        *(undefined8 *)(fn_l + 0x28) = 0;
        pcVar2 = string_dup(*(string_alloc_t **)fn_l,fn);
        *(char **)(fn_l + 0x20) = pcVar2;
        if (pcVar2 != (char *)0x0) {
          if ((4 < _id_alloc) && (iVar1 = strcmp(fn + (_id_alloc - 4),".fai"), iVar1 == 0)) {
            *(undefined1 *)(*(long *)(fn_l + 0x20) + (_id_alloc - 4)) = 0;
          }
          pBVar3 = bgzf_open_ref(*(char **)(fn_l + 0x20),"r");
          *(BGZF **)(fn_l + 0x28) = pBVar3;
          if (pBVar3 != (BGZF *)0x0) {
            sprintf(line + 0x1ff8,"%.*s.fai",0xffb,*(undefined8 *)(fn_l + 0x20));
            iVar1 = stat(line + 0x1ff8,(stat *)&fp);
            if (iVar1 == 0) {
              __stream = fopen(line + 0x1ff8,"r");
              if (__stream != (FILE *)0x0) {
                while( true ) {
                  pcVar2 = fgets((char *)&r,0x2000,__stream);
                  if (pcVar2 == (char *)0x0) {
                    return (refs_t *)fn_l;
                  }
                  cp = (char *)malloc(0x38);
                  if (cp == (char *)0x0) break;
                  _k = &r;
                  while( true ) {
                    bVar8 = false;
                    if (*(char *)_k != '\0') {
                      ppuVar4 = __ctype_b_loc();
                      bVar8 = ((*ppuVar4)[(int)*(char *)_k] & 0x2000) == 0;
                    }
                    if (!bVar8) break;
                    _k = (refs_t **)((long)_k + 1);
                  }
                  *(char *)_k = '\0';
                  _k = (refs_t **)((long)_k + 1);
                  pcVar2 = string_dup(*(string_alloc_t **)fn_l,(char *)&r);
                  *(char **)cp = pcVar2;
                  while( true ) {
                    bVar8 = false;
                    if (*(char *)_k != '\0') {
                      ppuVar4 = __ctype_b_loc();
                      bVar8 = ((*ppuVar4)[(int)*(char *)_k] & 0x2000) != 0;
                    }
                    if (!bVar8) break;
                    _k = (refs_t **)((long)_k + 1);
                  }
                  lVar5 = strtoll((char *)_k,(char **)&k,10);
                  *(longlong *)(cp + 0x10) = lVar5;
                  while( true ) {
                    bVar8 = false;
                    if (*(char *)_k != '\0') {
                      ppuVar4 = __ctype_b_loc();
                      bVar8 = ((*ppuVar4)[(int)*(char *)_k] & 0x2000) != 0;
                    }
                    if (!bVar8) break;
                    _k = (refs_t **)((long)_k + 1);
                  }
                  lVar5 = strtoll((char *)_k,(char **)&k,10);
                  *(longlong *)(cp + 0x18) = lVar5;
                  while( true ) {
                    bVar8 = false;
                    if (*(char *)_k != '\0') {
                      ppuVar4 = __ctype_b_loc();
                      bVar8 = ((*ppuVar4)[(int)*(char *)_k] & 0x2000) != 0;
                    }
                    if (!bVar8) break;
                    _k = (refs_t **)((long)_k + 1);
                  }
                  lVar6 = strtol((char *)_k,(char **)&k,10);
                  *(int *)(cp + 0x20) = (int)lVar6;
                  while( true ) {
                    bVar8 = false;
                    if (*(char *)_k != '\0') {
                      ppuVar4 = __ctype_b_loc();
                      bVar8 = ((*ppuVar4)[(int)*(char *)_k] & 0x2000) != 0;
                    }
                    if (!bVar8) break;
                    _k = (refs_t **)((long)_k + 1);
                  }
                  lVar6 = strtol((char *)_k,(char **)&k,10);
                  *(int *)(cp + 0x24) = (int)lVar6;
                  *(undefined8 *)(cp + 8) = *(undefined8 *)(fn_l + 0x20);
                  cp[0x28] = '\0';
                  cp[0x29] = '\0';
                  cp[0x2a] = '\0';
                  cp[0x2b] = '\0';
                  cp[0x2c] = '\0';
                  cp[0x2d] = '\0';
                  cp[0x2e] = '\0';
                  cp[0x2f] = '\0';
                  cp[0x30] = '\0';
                  cp[0x31] = '\0';
                  cp[0x32] = '\0';
                  cp[0x33] = '\0';
                  cp[0x34] = '\0';
                  cp[0x35] = '\0';
                  cp[0x36] = '\0';
                  cp[0x37] = '\0';
                  re._0_4_ = kh_put_refs(*(kh_refs_t **)(fn_l + 8),*(kh_cstr_t *)cp,
                                         (int *)((long)&re + 4));
                  if (re._4_4_ == -1) {
                    free(cp);
                    return (refs_t *)0x0;
                  }
                  if (re._4_4_ == 0) {
                    pvVar7 = *(void **)(*(long *)(*(long *)(fn_l + 8) + 0x20) +
                                       (ulong)(khint_t)re * 8);
                    if ((pvVar7 == (void *)0x0) ||
                       ((*(long *)((long)pvVar7 + 0x28) == 0 &&
                        (*(long *)((long)pvVar7 + 0x10) == 0)))) {
                      if (pvVar7 != (void *)0x0) {
                        free(pvVar7);
                      }
                      *(char **)(*(long *)(*(long *)(fn_l + 8) + 0x20) + (ulong)(khint_t)re * 8) =
                           cp;
                    }
                    else {
                      free(cp);
                    }
                  }
                  else {
                    *(char **)(*(long *)(*(long *)(fn_l + 8) + 0x20) + (ulong)(khint_t)re * 8) = cp;
                  }
                  if ((int)e <= e._4_4_) {
                    if ((int)e == 0) {
                      local_3110 = 0x10;
                    }
                    else {
                      local_3110 = (int)e << 1;
                    }
                    e._0_4_ = local_3110;
                    pvVar7 = realloc(*(void **)(fn_l + 0x10),(long)local_3110 << 3);
                    *(void **)(fn_l + 0x10) = pvVar7;
                    for (local_3104 = e._4_4_; local_3104 < (int)e; local_3104 = local_3104 + 1) {
                      *(undefined8 *)(*(long *)(fn_l + 0x10) + (long)local_3104 * 8) = 0;
                    }
                  }
                  *(char **)(*(long *)(fn_l + 0x10) + (long)e._4_4_ * 8) = cp;
                  e._4_4_ = e._4_4_ + 1;
                  *(int *)(fn_l + 0x18) = e._4_4_;
                }
                return (refs_t *)0x0;
              }
              if (sb.__glibc_reserved[2]._4_4_ != 0) {
                perror(line + 0x1ff8);
              }
            }
            else if (sb.__glibc_reserved[2]._4_4_ != 0) {
              perror(line + 0x1ff8);
            }
          }
        }
      }
    }
    else if (sb.__glibc_reserved[2]._4_4_ != 0) {
      perror(fn);
    }
  }
  if (r_orig == (refs_t *)0x0) {
    refs_free((refs_t *)fn_l);
  }
  return (refs_t *)0x0;
}

Assistant:

static refs_t *refs_load_fai(refs_t *r_orig, char *fn, int is_err) {
    struct stat sb;
    FILE *fp = NULL;
    char fai_fn[PATH_MAX];
    char line[8192];
    refs_t *r = r_orig;
    size_t fn_l = strlen(fn);
    int id = 0, id_alloc = 0;

    RP("refs_load_fai %s\n", fn);

    if (!r)
	if (!(r = refs_create()))
	    goto err;

    /* Open reference, for later use */
    if (stat(fn, &sb) != 0) {
	if (is_err)
	    perror(fn);
	goto err;
    }

    if (r->fp)
	if (bgzf_close(r->fp) != 0)
	    goto err;
    r->fp = NULL;

    if (!(r->fn = string_dup(r->pool, fn)))
	goto err;
	
    if (fn_l > 4 && strcmp(&fn[fn_l-4], ".fai") == 0)
	r->fn[fn_l-4] = 0;

    if (!(r->fp = bgzf_open_ref(r->fn, "r")))
	goto err;

    /* Parse .fai file and load meta-data */
    sprintf(fai_fn, "%.*s.fai", PATH_MAX-5, r->fn);

    if (stat(fai_fn, &sb) != 0) {
	if (is_err)
	    perror(fai_fn);
	goto err;
    }
    if (!(fp = fopen(fai_fn, "r"))) {
	if (is_err)
	    perror(fai_fn);
	goto err;
    }
    while (fgets(line, 8192, fp) != NULL) {
	ref_entry *e = malloc(sizeof(*e));
	char *cp;
	int n;
	khint_t k;

	if (!e)
	    return NULL;

	// id
	for (cp = line; *cp && !isspace(*cp); cp++)
	    ;
	*cp++ = 0;
	e->name = string_dup(r->pool, line);
	
	// length
	while (*cp && isspace(*cp))
	    cp++;
	e->length = strtoll(cp, &cp, 10);

	// offset
	while (*cp && isspace(*cp))
	    cp++;
	e->offset = strtoll(cp, &cp, 10);

	// bases per line
	while (*cp && isspace(*cp))
	    cp++;
	e->bases_per_line = strtol(cp, &cp, 10);

	// line length
	while (*cp && isspace(*cp))
	    cp++;
	e->line_length = strtol(cp, &cp, 10);

	// filename
	e->fn = r->fn;

	e->count = 0;
	e->seq = NULL;

	k = kh_put(refs, r->h_meta, e->name, &n);
	if (-1 == n)  {
	    free(e);
	    return NULL;
	}

	if (n) {
	    kh_val(r->h_meta, k) = e;
	} else {
	    ref_entry *re = kh_val(r->h_meta, k);
	    if (re && (re->count != 0 || re->length != 0)) {
		/* Keep old */
		free(e);
	    } else {
		/* Replace old */
		if (re)
		    free(re);
		kh_val(r->h_meta, k) = e;
	    }
	}

	if (id >= id_alloc) {
	    int x;

	    id_alloc = id_alloc ?id_alloc*2 : 16;
	    r->ref_id = realloc(r->ref_id, id_alloc * sizeof(*r->ref_id));

	    for (x = id; x < id_alloc; x++)
		r->ref_id[x] = NULL;
	}
	r->ref_id[id] = e;
	r->nref = ++id;
    }

    return r;

 err:
    if (fp)
	fclose(fp);

    if (!r_orig)
	refs_free(r);
    
    return NULL;
}